

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O3

void cleanup(EVP_PKEY_CTX *ctx)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  
  if (initialized != 0) {
    post(&exit_message);
    if (nthreads != 0) {
      lVar2 = 0;
      uVar3 = 0;
      do {
        iVar1 = uv_thread_join((uv_thread_t *)((long)threads + lVar2));
        if (iVar1 != 0) {
          abort();
        }
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 8;
      } while (uVar3 < nthreads);
    }
    if (threads != default_threads) {
      uv__free(threads);
    }
    uv_mutex_destroy(&mutex);
    uv_cond_destroy(&cond);
    threads = (uv_thread_t *)0x0;
    nthreads = 0;
    initialized = 0;
  }
  return;
}

Assistant:

static void
cleanup(void *data)
{
	struct name_cache *cache = (struct name_cache *)data;
	size_t i;

	if (cache != NULL) {
		for (i = 0; i < cache->size; i++) {
			if (cache->cache[i].name != NULL &&
			    cache->cache[i].name != NO_NAME)
				free((void *)(uintptr_t)cache->cache[i].name);
		}
		free(cache->buff);
		free(cache);
	}
}